

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O2

uint32_t raplcap_get_num_die(raplcap *rc,uint32_t pkg)

{
  int iVar1;
  raplcap *prVar2;
  int *piVar3;
  uint32_t uVar4;
  raplcap_msr_sys_ctx *ctx;
  uint32_t n_pkg;
  uint32_t n_die;
  uint local_20;
  uint32_t local_1c;
  
  prVar2 = &rc_default;
  if (rc != (raplcap *)0x0) {
    prVar2 = rc;
  }
  if (prVar2->state == (void *)0x0) {
    ctx = (raplcap_msr_sys_ctx *)0x0;
  }
  else {
    ctx = *(raplcap_msr_sys_ctx **)((long)prVar2->state + 0x38);
  }
  iVar1 = msr_sys_get_num_pkg_die(ctx,&local_20,&local_1c);
  uVar4 = 0;
  if ((iVar1 == 0) && (uVar4 = local_1c, local_20 <= pkg)) {
    fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
    fprintf(_stderr,"Package %u not in range [0, %u)\n",pkg,(ulong)local_20);
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

uint32_t raplcap_get_num_die(const raplcap* rc, uint32_t pkg) {
  const raplcap_msr* state;
  const raplcap_msr_sys_ctx* sys;
  uint32_t n_pkg;
  uint32_t n_die;
  if (rc == NULL) {
    rc = &rc_default;
  }
  if ((state = (raplcap_msr*) rc->state) != NULL) {
    sys = state->sys;
  } else {
    sys = NULL;
  }
  if (msr_sys_get_num_pkg_die(sys, &n_pkg, &n_die)) {
    return 0;
  }
  if (pkg >= n_pkg) {
    raplcap_log(ERROR, "Package %"PRIu32" not in range [0, %"PRIu32")\n", pkg, n_pkg);
    errno = EINVAL;
    return 0;
  }
  return n_die;
}